

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O2

void __thiscall ProjectWriter::writeControls(ProjectWriter *this)

{
  pointer ppCVar1;
  ostream *poVar2;
  pointer ppCVar3;
  string local_50;
  
  std::operator<<((ostream *)&this->field_0x18,"\n[CONTROLS]\n");
  ppCVar1 = (this->network->controls).super__Vector_base<Control_*,_std::allocator<Control_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar3 = (this->network->controls).super__Vector_base<Control_*,_std::allocator<Control_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar1;
      ppCVar3 = ppCVar3 + 1) {
    Control::toStr_abi_cxx11_(&local_50,*ppCVar3,this->network);
    poVar2 = std::operator<<((ostream *)&this->field_0x18,(string *)&local_50);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void ProjectWriter::writeControls()
{
    fout << "\n[CONTROLS]\n";
    for (Control* control : network->controls)
    {
        fout << control->toStr(network) << "\n";
    }
}